

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Testing2_640x480at60_25.175MHz_Dice.c
# Opt level: O3

void displayLine(void)

{
  int iVar1;
  
  line_cnt = ((byte)line & 7) << 4;
  iVar1 = 0x28;
  do {
    putchar(line_cnt | 0xf);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  line = line + 1;
  line_cnt = ((byte)line & 7) << 4;
  putchar((uint)(line_cnt | 0xd));
  iVar1 = 6;
  do {
    putchar(line_cnt | 9);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  iVar1 = 3;
  do {
    putchar(line_cnt | 0xd);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return;
}

Assistant:

void displayLine() {


    // This is very bad design.  Global Variable and spooky action at a distance.
    line_cnt = line;
    line_cnt = line_cnt<<4;
    line_cnt = line_cnt&0b01110000;

    // Display
    for(int i=0; i<(640/16); i++) {
        putchar(0b00001111|line_cnt);
    }

    // Count ahead
    line++;
    line_cnt = line;
    line_cnt = line_cnt<<4;
    line_cnt = line_cnt&0b01110000;

    // Front Porch
    for(int i=0; i<(16/16); i++) {
        putchar(0b00001101|line_cnt);
    }

    // hSync
    for(int i=0; i<(96/16); i++) {
        putchar(0b00001001|line_cnt);
    }

    // Back Porch
    for(int i=0; i<(48/16); i++) {
        putchar(0b00001101|line_cnt);
    }

}